

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O0

bool dmlc::serializer::Handler<unsigned_short>::Read(Stream *strm,unsigned_short *data)

{
  bool bVar1;
  unsigned_short *data_local;
  Stream *strm_local;
  
  bVar1 = IfThenElse<true,_dmlc::serializer::ArithmeticHandler<unsigned_short>,_dmlc::serializer::IfThenElse<true,_dmlc::serializer::NativePODHandler<unsigned_short>,_dmlc::serializer::IfThenElse<false,_dmlc::serializer::SaveLoadClassHandler<unsigned_short>,_dmlc::serializer::UndefinedSerializerFor<unsigned_short>,_unsigned_short>,_unsigned_short>,_unsigned_short>
          ::Read(strm,data);
  return bVar1;
}

Assistant:

inline static bool Read(Stream *strm, T *data) {
    return IfThenElse<dmlc::is_arithmetic<T>::value,
                      ArithmeticHandler<T>,
                      IfThenElse<dmlc::is_pod<T>::value && DMLC_IO_NO_ENDIAN_SWAP,
                                 NativePODHandler<T>,
                                 IfThenElse<dmlc::has_saveload<T>::value,
                                            SaveLoadClassHandler<T>,
                                            UndefinedSerializerFor<T>, T>,
                                 T>,
                      T>::Read(strm, data);
  }